

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

extent_t *
extent_alloc_wrapper
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,void *new_addr,size_t size,
          size_t pad,size_t alignment,_Bool slab,szind_t szind,_Bool *zero,_Bool *commit)

{
  byte *pbVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  extents_t *peVar4;
  ulong *puVar5;
  _Bool _Var6;
  extent_state_t eVar7;
  ulong uVar8;
  long lVar9;
  _Bool _Var10;
  int iVar11;
  extent_split_interior_result_t eVar12;
  extent_hooks_t *peVar13;
  extent_t *peVar14;
  ulong uVar15;
  void *pvVar16;
  size_t sVar17;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar18;
  uint uVar19;
  uint uVar20;
  arena_t *paVar21;
  ulong uVar22;
  undefined1 growing_retained;
  _Bool *p_Var23;
  extent_t **lead_00;
  int iVar24;
  extent_hooks_t **ppeVar25;
  rtree_ctx_t *prVar26;
  byte bVar27;
  tsd_t *tsd;
  bool bVar28;
  szind_t in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc60;
  _Bool committed;
  _Bool zeroed;
  extent_hooks_t **local_398;
  pthread_mutex_t *local_390;
  void *local_388;
  arena_t *local_380;
  size_t local_378;
  extent_t *extent;
  extents_t *local_368;
  void *local_360;
  ulong local_358;
  extent_t *to_salvage;
  extent_t *to_leak;
  extent_t *trail;
  extent_t *lead;
  rtree_ctx_t local_330;
  rtree_ctx_t rtree_ctx_fallback;
  
  local_388 = (void *)size;
  if (*r_extent_hooks == (extent_hooks_t *)0x0) {
    peVar13 = base_extent_hooks_get(arena->base);
    *r_extent_hooks = peVar13;
  }
  local_390 = (pthread_mutex_t *)((long)&(arena->extent_grow_mtx).field_0 + 0x40);
  iVar11 = pthread_mutex_trylock(local_390);
  if (iVar11 != 0) {
    malloc_mutex_lock_slow(&arena->extent_grow_mtx);
    (arena->extent_grow_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->extent_grow_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->extent_grow_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->extent_grow_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->extent_grow_mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  peVar4 = &arena->extents_retained;
  uVar15 = (ulong)slab;
  local_398 = r_extent_hooks;
  peVar14 = extent_recycle(tsdn,arena,r_extent_hooks,peVar4,new_addr,(size_t)local_388,pad,alignment
                           ,slab,szind,zero,commit,SUB41(in_stack_fffffffffffffc58,0));
  if (peVar14 == (extent_t *)0x0) {
    local_380 = arena;
    local_378 = pad;
    local_368 = peVar4;
    local_358 = uVar15;
    if ((new_addr == (void *)0x0) && (opt_retain != false)) {
      uVar15 = (((long)local_388 + pad) - 0x1000) + (alignment + 0xfff & 0xfffffffffffff000);
      if ((long)local_388 + pad <= uVar15) {
        uVar19 = arena->extent_grow_next;
        iVar11 = 1;
        do {
          uVar8 = sz_pind2sz_tab[uVar19];
          if (uVar15 <= uVar8) {
            paVar21 = arena;
            peVar14 = extent_alloc(tsdn,arena);
            extent = peVar14;
            if (peVar14 == (extent_t *)0x0) break;
            zeroed = false;
            committed = false;
            if (*local_398 == &extent_hooks_default) {
              p_Var23 = &zeroed;
              local_360 = extent_alloc_default_impl
                                    (tsdn,arena,(void *)0x0,uVar8,0x1000,p_Var23,&committed);
              growing_retained = SUB81(p_Var23,0);
            }
            else {
              extent_hook_pre_reentrancy(tsdn,paVar21);
              p_Var23 = &committed;
              local_360 = (*(*local_398)->alloc)
                                    (*local_398,(void *)0x0,uVar8,0x1000,&zeroed,p_Var23,
                                     arena->base->ind);
              growing_retained = SUB81(p_Var23,0);
              extent_hook_post_reentrancy(tsdn);
            }
            sVar17 = arena_extent_sn_next(arena);
            if (arena == (arena_t *)0x0) {
              uVar15 = 0xfff;
            }
            else {
              uVar15 = (ulong)(arena->base->ind & 0xfc000fff);
            }
            peVar14->e_addr = local_360;
            (peVar14->field_2).e_size_esn = (uint)(peVar14->field_2).e_size_esn & 0xfff | uVar8;
            peVar14->e_bits =
                 (ulong)((uint)zeroed << 0xf | (uint)committed << 0xd) |
                 sVar17 << 0x2a | peVar14->e_bits & 0x3fffc000000 | uVar15 | 0x3a04000;
            (peVar14->ql_link).qre_next = peVar14;
            (peVar14->ql_link).qre_prev = peVar14;
            if (local_360 == (void *)0x0) {
              extent_dalloc(tsdn,arena,peVar14);
              break;
            }
            _Var10 = extent_register_impl(tsdn,peVar14,false);
            if (_Var10) {
              eVar7 = (arena->extents_retained).state;
              to_leak = peVar14;
            }
            else {
              uVar19 = (uint)peVar14->e_bits;
              if ((~uVar19 & 0xa000) == 0) {
                *zero = true;
              }
              if ((uVar19 >> 0xd & 1) != 0) {
                *commit = true;
              }
              if (tsdn == (tsdn_t *)0x0) {
                prVar26 = &rtree_ctx_fallback;
                rtree_ctx_data_init(prVar26);
              }
              else {
                prVar26 = &(tsdn->tsd).
                           cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
              }
              lead_00 = &lead;
              eVar12 = extent_split_interior
                                 (tsdn,arena,local_398,prVar26,&extent,lead_00,&trail,&to_leak,
                                  &to_salvage,local_388,local_378,alignment,local_358,SUB41(szind,0)
                                  ,in_stack_fffffffffffffc58,(_Bool)in_stack_fffffffffffffc60);
              peVar4 = local_368;
              uVar18 = (undefined1)in_stack_fffffffffffffc58;
              growing_retained = SUB81(lead_00,0);
              if (eVar12 == extent_split_interior_ok) {
                if (lead != (extent_t *)0x0) {
                  extent_record(tsdn,local_380,local_398,local_368,lead,(_Bool)growing_retained);
                }
                if (trail != (extent_t *)0x0) {
                  extent_record(tsdn,local_380,local_398,peVar4,trail,(_Bool)growing_retained);
                }
                peVar14 = extent;
                arena = local_380;
                ppeVar25 = local_398;
                if ((*commit == true) && ((extent->e_bits & 0x2000) == 0)) {
                  uVar15 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
                  _Var10 = extent_commit_impl(tsdn,local_380,local_398,extent,0,uVar15,(_Bool)uVar18
                                             );
                  if (_Var10) {
                    extent_record(tsdn,arena,ppeVar25,local_368,peVar14,SUB81(uVar15,0));
                    break;
                  }
                  peVar13 = base_extent_hooks_get(arena->base);
                  if ((peVar13 == &extent_hooks_default) && (opt_thp != thp_mode_always)) {
                    pbVar1 = (byte *)((long)&peVar14->e_bits + 1);
                    *pbVar1 = *pbVar1 | 0x80;
                  }
                }
                uVar19 = iVar11 + arena->extent_grow_next;
                if (arena->retain_grow_limit <= uVar19) {
                  uVar19 = arena->retain_grow_limit;
                }
                arena->extent_grow_next = uVar19;
                (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
                pthread_mutex_unlock(local_390);
                if (local_378 != 0) {
                  extent_addr_randomize(tsdn,extent,alignment);
                }
                ppeVar25 = local_398;
                peVar14 = extent;
                if (slab) {
                  if (tsdn == (tsdn_t *)0x0) {
                    prVar26 = &local_330;
                    rtree_ctx_data_init(prVar26);
                  }
                  else {
                    prVar26 = &(tsdn->tsd).
                               cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
                  }
                  peVar14 = extent;
                  extent->e_bits = extent->e_bits | 0x1000;
                  extent_interior_register(tsdn,prVar26,extent,szind);
                }
                if (*zero == true) {
                  if ((peVar14->e_bits & 0x8000) != 0) {
                    return peVar14;
                  }
                  pvVar16 = (void *)((ulong)peVar14->e_addr & 0xfffffffffffff000);
                  uVar15 = (peVar14->field_2).e_size_esn & 0xfffffffffffff000;
                  peVar13 = base_extent_hooks_get(arena->base);
                  if (((peVar13 == &extent_hooks_default) && (opt_thp != thp_mode_always)) &&
                     (_Var10 = pages_purge_forced(pvVar16,uVar15), !_Var10)) {
                    return peVar14;
                  }
                  memset(pvVar16,0,uVar15);
                  return peVar14;
                }
                if (peVar14 != (extent_t *)0x0) {
                  return peVar14;
                }
                goto LAB_0012c12c;
              }
              uVar18 = extraout_DL;
              if (to_salvage != (extent_t *)0x0) {
                extent_record(tsdn,arena,local_398,local_368,to_salvage,(_Bool)growing_retained);
                uVar18 = extraout_DL_00;
              }
              if (to_leak == (extent_t *)0x0) break;
              extent_deregister_impl(tsdn,to_leak,(_Bool)uVar18);
              eVar7 = (arena->extents_retained).state;
            }
            extents_leak(tsdn,arena,local_398,(extents_t *)(ulong)eVar7,to_leak,
                         (_Bool)growing_retained);
            break;
          }
          for (lVar9 = 0x3f; 0xdfffffffffffffffU >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
          uVar20 = (uint)lVar9;
          iVar24 = uVar20 - 0xe;
          if (uVar20 < 0xe) {
            iVar24 = 0;
          }
          bVar27 = (char)lVar9 - 3;
          if (uVar20 < 0xf) {
            bVar27 = 0xc;
          }
          uVar19 = uVar19 + 1;
          iVar11 = iVar11 + 1;
        } while (uVar19 < ((uint)(((0x6fffffffffffffffU >> (bVar27 & 0x3f)) << (bVar27 & 0x3f)) >>
                                 (bVar27 & 0x3f)) & 3) + iVar24 * 4);
      }
      (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(local_390);
      ppeVar25 = local_398;
    }
    else {
      (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(local_390);
      ppeVar25 = local_398;
    }
LAB_0012c12c:
    if (((new_addr == (void *)0x0) || (opt_retain == false)) &&
       (paVar21 = arena, peVar14 = extent_alloc(tsdn,arena), peVar14 != (extent_t *)0x0)) {
      sVar17 = (long)local_388 + local_378;
      uVar15 = alignment + 0xfff & 0xfffffffffffff000;
      local_388 = (void *)sVar17;
      if (*ppeVar25 == &extent_hooks_default) {
        pvVar16 = extent_alloc_default_impl(tsdn,arena,new_addr,sVar17,uVar15,zero,commit);
      }
      else {
        local_390 = (pthread_mutex_t *)new_addr;
        extent_hook_pre_reentrancy(tsdn,paVar21);
        pvVar16 = (*(*ppeVar25)->alloc)
                            (*ppeVar25,local_390,sVar17,uVar15,zero,commit,arena->base->ind);
        extent_hook_post_reentrancy(tsdn);
      }
      if (pvVar16 == (void *)0x0) {
        extent_dalloc(tsdn,arena,peVar14);
      }
      else {
        sVar17 = arena_extent_sn_next(arena);
        _Var10 = *zero;
        _Var6 = *commit;
        uVar19 = arena->base->ind;
        peVar14->e_addr = pvVar16;
        (peVar14->field_2).e_size_esn =
             (ulong)((uint)(peVar14->field_2).e_size_esn & 0xfff) | (ulong)local_388;
        uVar15 = (ulong)szind << 0x12;
        peVar14->e_bits =
             (ulong)_Var6 << 0xd |
             (ulong)_Var10 << 0xf |
             sVar17 << 0x2a | uVar15 & 0x3fffffc0000 | (ulong)(uint)((int)local_358 << 0xc) |
             peVar14->e_bits & 0x3fffc000000 | (ulong)(uVar19 & 0xfc000fff) | 0x4000;
        (peVar14->ql_link).qre_next = peVar14;
        (peVar14->ql_link).qre_prev = peVar14;
        if (alignment < 0x1000 && local_378 != 0) {
          uVar20 = (int)alignment + 0x3fU & 0x1fc0;
          alignment = 0x3f;
          if (uVar20 != 0) {
            for (; uVar20 >> alignment == 0; alignment = alignment - 1) {
            }
          }
          bVar27 = (byte)alignment;
          if (tsdn == (tsdn_t *)0x0) {
            pvVar16 = arenas[uVar19 & 0xfff].repr;
            uVar8 = *(ulong *)((long)pvVar16 + 0x2850);
            uVar22 = uVar8 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
            do {
              puVar5 = (ulong *)((long)pvVar16 + 0x2850);
              LOCK();
              bVar28 = uVar8 == *puVar5;
              if (bVar28) {
                *puVar5 = uVar22;
              }
              UNLOCK();
            } while (bVar28);
            uVar22 = uVar22 >> (-('\f' - bVar27) & 0x3f);
            pvVar16 = peVar14->e_addr;
          }
          else {
            uVar22 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_offset_state
                     * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
            (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_offset_state = uVar22;
            uVar22 = uVar22 >> (bVar27 + 0x34 & 0x3f);
          }
          peVar14->e_addr = (void *)((uVar22 << (bVar27 & 0x3f)) + (long)pvVar16);
        }
        _Var10 = extent_register_impl(tsdn,peVar14,SUB81(alignment,0));
        if (!_Var10) {
          return peVar14;
        }
        extents_leak(tsdn,arena,local_398,(extents_t *)(ulong)(arena->extents_retained).state,
                     peVar14,SUB81(uVar15,0));
      }
    }
    peVar14 = (extent_t *)0x0;
  }
  else {
    (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(local_390);
  }
  return peVar14;
}

Assistant:

extent_t *
extent_alloc_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_hooks_assure_initialized(arena, r_extent_hooks);

	extent_t *extent = extent_alloc_retained(tsdn, arena, r_extent_hooks,
	    new_addr, size, pad, alignment, slab, szind, zero, commit);
	if (extent == NULL) {
		if (opt_retain && new_addr != NULL) {
			/*
			 * When retain is enabled and new_addr is set, we do not
			 * attempt extent_alloc_wrapper_hard which does mmap
			 * that is very unlikely to succeed (unless it happens
			 * to be at the end).
			 */
			return NULL;
		}
		extent = extent_alloc_wrapper_hard(tsdn, arena, r_extent_hooks,
		    new_addr, size, pad, alignment, slab, szind, zero, commit);
	}

	assert(extent == NULL || extent_dumpable_get(extent));
	return extent;
}